

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleFile.cpp
# Opt level: O2

int __thiscall ModuleFile::open(ModuleFile *this,char *__file,int __oflag,...)

{
  FormatError FVar1;
  Module *this_00;
  int iVar2;
  undefined8 unaff_RBP;
  bool bVar3;
  string local_250;
  ifstream in;
  byte abStack_210 [488];
  
  QString::toStdString_abi_cxx11_(&local_250,(QString *)__file);
  std::ifstream::ifstream(&in,(string *)&local_250,_S_in|_S_bin);
  std::__cxx11::string::~string((string *)&local_250);
  bVar3 = (abStack_210[*(long *)(_in + -0x18)] & 5) != 0;
  this->mIoError = bVar3;
  if (!bVar3) {
    this_00 = Module::data(___oflag);
    FVar1 = trackerboy::Module::deserialize(this_00,(istream *)&in);
    this->mLastError = FVar1;
    this->mIoError = (abStack_210[*(long *)(_in + -0x18)] & 5) != 0;
    if (FVar1 == none) {
      updateFilename(this,(QString *)__file);
      iVar2 = (int)CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
      Module::reset(___oflag);
      goto LAB_0014a238;
    }
    Module::clear(___oflag);
  }
  iVar2 = 0;
LAB_0014a238:
  std::ifstream::~ifstream(&in);
  return iVar2;
}

Assistant:

bool ModuleFile::open(QString const& path, Module &mod) {
    
    std::ifstream in(path.toStdString(), std::ios::binary | std::ios::in);
    mIoError = in.fail();

    if (!mIoError) {

        mLastError = mod.data().deserialize(in);
        mIoError = in.fail();
        if (mLastError == trackerboy::FormatError::none) {
            updateFilename(path);
            // emits the reset signal
            mod.reset();
            return true;
        } else {
            // failed to deserialize module but the module might be paritially loaded
            // clear it
            mod.clear();
        }
    }

    return false;
}